

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3Insert(Parse *pParse,SrcList *pTabList,Select *pSelect,IdList *pColumn,int onError,
                  Upsert *pUpsert)

{
  u8 uVar1;
  short sVar2;
  sqlite3 *db;
  Schema *pSVar3;
  IdList_item *pIVar4;
  char *zLeft;
  Index *pIVar5;
  Expr *pExpr;
  undefined1 auVar6 [16];
  Select *p;
  ushort uVar7;
  int iVar8;
  Table *pTab;
  Vdbe *p_00;
  int *piVar9;
  undefined4 extraout_var;
  ulong uVar10;
  Parse *pPVar11;
  HashElem *pHVar12;
  u16 uVar13;
  uint uVar14;
  ulong uVar15;
  Index **ppIVar16;
  Op *pOVar17;
  Schema **ppSVar18;
  long lVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  int op;
  ExprList *pList;
  uint uVar23;
  undefined4 in_register_00000084;
  undefined8 uVar24;
  ulong uVar25;
  byte bVar26;
  Column *pCVar27;
  int iVar28;
  VTable *zP4;
  ulong uVar29;
  Trigger *pTrigger;
  bool bVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int *local_168;
  int local_148;
  int iDataCur;
  IdList_item *local_138;
  uint local_12c;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  int local_10c;
  undefined8 local_108;
  ulong local_100;
  Trigger *local_f8;
  SrcList *local_f0;
  Select *local_e8;
  ulong local_e0;
  ExprList *local_d8;
  int local_d0;
  int local_cc;
  uint local_c8;
  int iIdxCur;
  long local_c0;
  ulong local_b8;
  ulong local_b0;
  Select *local_a8;
  undefined8 local_a0;
  int tmask;
  ExprList_item *local_90;
  SelectDest local_88;
  int isReplace;
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  long lVar33;
  
  uVar24 = CONCAT44(in_register_00000084,onError);
  iDataCur = 0;
  iIdxCur = 0;
  db = pParse->db;
  if ((pParse->nErr != 0) || (db->mallocFailed != '\0')) {
    sqlite3SrcListDelete(db,pTabList);
    local_168 = (int *)0x0;
    goto LAB_00162e7b;
  }
  local_88.iSDParm = 0;
  local_a0 = uVar24;
  if (pSelect == (Select *)0x0) {
    local_d8 = (ExprList *)0x0;
LAB_00162f2f:
    pSelect = (Select *)0x0;
  }
  else {
    if (((pSelect->selFlags & 0x200) != 0) && (pSelect->pPrior == (Select *)0x0)) {
      local_d8 = pSelect->pEList;
      pSelect->pEList = (ExprList *)0x0;
      clearSelect(db,pSelect,1);
      goto LAB_00162f2f;
    }
    local_d8 = (ExprList *)0x0;
  }
  local_e8 = pSelect;
  pTab = sqlite3SrcListLookup(pParse,pTabList);
  local_f0 = pTabList;
  if (pTab == (Table *)0x0) {
LAB_00163023:
    local_168 = (int *)0x0;
LAB_0016302c:
    sqlite3SrcListDelete(db,local_f0);
    pList = local_d8;
    pSelect = local_e8;
    if (local_d8 == (ExprList *)0x0) goto LAB_00162e7b;
  }
  else {
    if (pTab->pSchema == (Schema *)0x0) {
      iVar28 = -1000000;
    }
    else {
      iVar28 = -1;
      ppSVar18 = &db->aDb->pSchema;
      do {
        iVar28 = iVar28 + 1;
        pSVar3 = *ppSVar18;
        ppSVar18 = ppSVar18 + 4;
      } while (pSVar3 != pTab->pSchema);
    }
    local_168 = (int *)0x0;
    iVar8 = sqlite3AuthCheck(pParse,0x12,pTab->zName,(char *)0x0,db->aDb[iVar28].zDbSName);
    if (iVar8 != 0) goto LAB_0016302c;
    local_12c = CONCAT31(local_12c._1_3_,(char)pTab->tabFlags);
    local_168 = (int *)0x0;
    local_f8 = sqlite3TriggersExist(pParse,pTab,0x78,(ExprList *)0x0,&tmask);
    local_a8 = pTab->pSelect;
    iVar8 = sqlite3ViewGetColumnNames(pParse,pTab);
    if (iVar8 != 0) goto LAB_0016302c;
    iVar8 = sqlite3IsReadOnly(pParse,pTab,tmask);
    if ((iVar8 != 0) || (p_00 = sqlite3GetVdbe(pParse), p_00 == (Vdbe *)0x0)) goto LAB_00163023;
    if (pParse->nested == '\0') {
      p_00->field_0xc5 = p_00->field_0xc5 | 0x20;
    }
    sqlite3BeginWriteOperation
              (pParse,(uint)(local_e8 != (Select *)0x0 || local_f8 != (Trigger *)0x0),iVar28);
    bVar26 = (byte)local_12c;
    if ((pColumn == (IdList *)0x0) &&
       (iVar8 = xferOptimization(pParse,pTab,local_e8,(int)local_a0,iVar28), iVar8 != 0)) {
      iVar28 = 0;
      local_168 = (int *)0x0;
LAB_00163140:
      if (((pParse->nested == '\0') && (pParse->pTriggerTab == (Table *)0x0)) &&
         (pParse->pAinc != (AutoincInfo *)0x0)) {
        autoIncrementEnd(pParse);
      }
      if (iVar28 != 0) {
        sqlite3VdbeAddOp3(p_00,0x51,iVar28,1,0);
        sqlite3VdbeSetNumCols(p_00,1);
        if (p_00->db->mallocFailed == '\0') {
          sqlite3VdbeMemSetStr(p_00->aColName,"rows inserted",-1,'\x01',(_func_void_void_ptr *)0x0);
        }
      }
      goto LAB_0016302c;
    }
    local_10c = autoIncBegin(pParse,iVar28,pTab);
    iVar8 = pParse->nMem;
    local_c8 = iVar8 + 1;
    uVar10 = (ulong)(uint)(int)pTab->nCol;
    iVar21 = pTab->nCol + iVar8;
    iVar22 = iVar21 + 1;
    pParse->nMem = iVar22;
    uVar20 = local_c8;
    if (pTab->nModuleArg != 0) {
      iVar22 = iVar21 + 2;
      pParse->nMem = iVar22;
      uVar20 = iVar8 + 2;
    }
    auVar6 = _DAT_001d4f80;
    local_e0 = CONCAT44(local_e0._4_4_,iVar22);
    local_120 = (ulong)uVar20;
    bVar30 = (pTab->tabFlags & 0x80) == 0;
    uVar29 = 0xffffffff;
    local_12c = CONCAT31(local_12c._1_3_,bVar26 >> 5);
    local_b0 = uVar10;
    if (pColumn != (IdList *)0x0) {
      iVar8 = pColumn->nId;
      uVar25 = (ulong)iVar8;
      if (0 < (long)uVar25) {
        pIVar4 = pColumn->a;
        lVar19 = uVar25 - 1;
        auVar31._8_4_ = (int)lVar19;
        auVar31._0_8_ = lVar19;
        auVar31._12_4_ = (int)((ulong)lVar19 >> 0x20);
        lVar19 = 0;
        auVar31 = auVar31 ^ _DAT_001d4f80;
        auVar32 = _DAT_001df100;
        auVar34 = _DAT_001df110;
        do {
          auVar35 = auVar34 ^ auVar6;
          iVar21 = auVar31._4_4_;
          if ((bool)(~(auVar35._4_4_ == iVar21 && auVar31._0_4_ < auVar35._0_4_ ||
                      iVar21 < auVar35._4_4_) & 1)) {
            *(undefined4 *)((long)&pIVar4->idx + lVar19) = 0xffffffff;
          }
          if ((auVar35._12_4_ != auVar31._12_4_ || auVar35._8_4_ <= auVar31._8_4_) &&
              auVar35._12_4_ <= auVar31._12_4_) {
            *(undefined4 *)((long)&pIVar4[1].idx + lVar19) = 0xffffffff;
          }
          auVar35 = auVar32 ^ auVar6;
          iVar22 = auVar35._4_4_;
          if (iVar22 <= iVar21 && (iVar22 != iVar21 || auVar35._0_4_ <= auVar31._0_4_)) {
            *(undefined4 *)((long)&pIVar4[2].idx + lVar19) = 0xffffffff;
            *(undefined4 *)((long)&pIVar4[3].idx + lVar19) = 0xffffffff;
          }
          lVar33 = auVar34._8_8_;
          auVar34._0_8_ = auVar34._0_8_ + 4;
          auVar34._8_8_ = lVar33 + 4;
          lVar33 = auVar32._8_8_;
          auVar32._0_8_ = auVar32._0_8_ + 4;
          auVar32._8_8_ = lVar33 + 4;
          lVar19 = lVar19 + 0x40;
        } while ((ulong)(iVar8 + 3U >> 2) << 6 != lVar19);
        if (0 < iVar8) {
          local_138 = pColumn->a;
          uVar29 = 0xffffffff;
          local_118 = CONCAT71(local_118._1_7_,bVar26 >> 5) & 0xffffffffffffff01;
          uVar15 = 0;
          local_100 = uVar25;
          do {
            local_c0 = uVar15 * 0x10;
            zLeft = local_138[uVar15].zName;
            if (0 < (short)local_b0) {
              pCVar27 = pTab->aCol;
              uVar25 = 0;
              do {
                iVar8 = sqlite3StrICmp(zLeft,pCVar27->zName);
                if (iVar8 == 0) {
                  *(int *)((long)&local_138->idx + local_c0) = (int)uVar25;
                  if (uVar15 != uVar25) {
                    bVar30 = false;
                  }
                  if ((long)pTab->iPKey == uVar25) {
                    uVar29 = uVar15 & 0xffffffff;
                  }
                  goto LAB_00163417;
                }
                uVar25 = uVar25 + 1;
                pCVar27 = pCVar27 + 1;
              } while (uVar10 != uVar25);
            }
            iVar8 = sqlite3IsRowid(zLeft);
            if ((iVar8 == 0) || ((char)local_118 != '\0')) {
              sqlite3ErrorMsg(pParse,"table %S has no column named %s",local_f0,0,zLeft);
              pParse->checkSchema = '\x01';
              goto LAB_00163626;
            }
            bVar30 = false;
            uVar29 = uVar15 & 0xffffffff;
LAB_00163417:
            uVar15 = uVar15 + 1;
          } while (uVar15 != local_100);
        }
      }
    }
    pList = local_d8;
    p = local_e8;
    uVar20 = (int)local_120 + 1;
    if (local_e8 != (Select *)0x0) {
      iVar8 = (int)local_e0 + 1;
      pParse->nMem = iVar8;
      local_138 = (IdList_item *)(ulong)(uint)p_00->nOp;
      sqlite3VdbeAddOp3(p_00,0xd,iVar8,0,p_00->nOp + 1);
      local_88.eDest = '\r';
      local_100 = CONCAT44(local_100._4_4_,uVar20);
      local_88.iSdst = uVar20;
      if (!bVar30) {
        local_88.iSdst = 0;
      }
      local_88.zAffSdst = (char *)0x0;
      local_88.nSdst = (int)pTab->nCol;
      local_88.iSDParm = iVar8;
      iVar21 = sqlite3Select(pParse,p,&local_88);
      pIVar4 = local_138;
      if (((iVar21 != 0) || (db->mallocFailed != '\0')) || (pParse->nErr != 0)) {
LAB_00163626:
        local_168 = (int *)0x0;
        goto LAB_0016302c;
      }
      local_128 = (ulong)(uint)local_88.iSdst;
      sqlite3VdbeAddOp3(p_00,0x43,iVar8,0,0);
      pPVar11 = p_00->pParse;
      pPVar11->nTempReg = '\0';
      pPVar11->nRangeReg = 0;
      if (p_00->db->mallocFailed == '\0') {
        iVar8 = p_00->nOp + -1;
        if (-1 < (int)pIVar4) {
          iVar8 = (int)pIVar4;
        }
        pOVar17 = p_00->aOp + iVar8;
      }
      else {
        pOVar17 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar17->p2 = p_00->nOp;
      uVar14 = local_e8->pEList->nExpr;
      if ((local_f8 == (Trigger *)0x0) && (iVar28 = readsTable(pParse,iVar28,pTab), iVar28 == 0)) {
        local_138 = (IdList_item *)((ulong)local_138 & 0xffffffff00000000);
        local_118 = 0;
      }
      else {
        uVar20 = pParse->nTab;
        local_118 = (ulong)uVar20;
        pParse->nTab = uVar20 + 1;
        uVar1 = pParse->nTempReg;
        if (uVar1 == '\0') {
          iVar28 = pParse->nMem + 1;
          pParse->nMem = iVar28;
LAB_00163b18:
          iVar8 = pParse->nMem + 1;
          pParse->nMem = iVar8;
        }
        else {
          bVar26 = uVar1 - 1;
          pParse->nTempReg = bVar26;
          iVar28 = pParse->aTempReg[bVar26];
          if (bVar26 == 0) goto LAB_00163b18;
          pParse->nTempReg = uVar1 - 2;
          iVar8 = pParse->aTempReg[(byte)(uVar1 - 2)];
        }
        sqlite3VdbeAddOp3(p_00,0x71,uVar20,uVar14,0);
        iVar21 = sqlite3VdbeAddOp3(p_00,0xe,local_88.iSDParm,0,0);
        sqlite3VdbeAddOp3(p_00,0x5c,(int)local_128,uVar14,iVar28);
        sqlite3VdbeAddOp3(p_00,0x79,uVar20,iVar8,0);
        sqlite3VdbeAddOp3(p_00,0x7a,uVar20,iVar28,iVar8);
        sqlite3VdbeAddOp3(p_00,0xb,0,iVar21,0);
        uVar20 = p_00->nOp;
        uVar10 = (ulong)uVar20;
        if (p_00->db->mallocFailed == '\0') {
          iVar22 = uVar20 - 1;
          if (-1 < iVar21) {
            iVar22 = iVar21;
          }
          pOVar17 = p_00->aOp + iVar22;
        }
        else {
          pOVar17 = (Op *)&sqlite3VdbeGetOp_dummy;
        }
        pOVar17->p2 = uVar20;
        if (iVar28 != 0) {
          uVar10 = (ulong)pParse->nTempReg;
          if (uVar10 < 8) {
            pParse->nTempReg = pParse->nTempReg + 1;
            pParse->aTempReg[uVar10] = iVar28;
          }
        }
        local_138 = (IdList_item *)CONCAT44(local_138._4_4_,(int)CONCAT71((int7)(uVar10 >> 8),1));
        if (iVar8 != 0) {
          bVar26 = pParse->nTempReg;
          if ((ulong)bVar26 < 8) {
            pParse->nTempReg = bVar26 + 1;
            pParse->aTempReg[bVar26] = iVar8;
          }
        }
      }
      uVar10 = local_128;
      uVar20 = (uint)local_100;
LAB_001635b3:
      if ((pColumn == (IdList *)0x0) && (0 < (int)uVar14)) {
        uVar29 = (ulong)(uint)(int)pTab->iPKey;
      }
      uVar23 = (uint)pTab->nCol;
      if ((int)uVar23 < 1) {
        iVar28 = 0;
      }
      else {
        lVar19 = 0;
        iVar28 = 0;
        do {
          iVar28 = iVar28 + (uint)(((&pTab->aCol->colFlags)[lVar19] >> 1 & 1) != 0);
          lVar19 = lVar19 + 0x20;
        } while ((ulong)uVar23 << 5 != lVar19);
      }
      if ((pColumn == (IdList *)0x0) && (uVar14 != 0)) {
        if (uVar14 == uVar23 - iVar28) {
LAB_00163687:
          local_e0 = 0;
          if ((((db->flags & 0x80) != 0) && (pParse->nested == '\0')) &&
             (pParse->pTriggerTab == (Table *)0x0)) {
            uVar23 = pParse->nMem + 1;
            local_e0 = (ulong)uVar23;
            pParse->nMem = uVar23;
            sqlite3VdbeAddOp3(p_00,0x46,0,uVar23,0);
          }
          if (local_a8 == (Select *)0x0) {
            local_168 = (int *)0x0;
            local_128 = uVar10;
            uVar23 = sqlite3OpenTableAndIndices
                               (pParse,pTab,0x6d,'\0',-1,(u8 *)0x0,&iDataCur,&iIdxCur);
            piVar9 = (int *)sqlite3DbMallocRawNN(db,(long)(int)uVar23 * 4 + 4);
            if (piVar9 == (int *)0x0) goto LAB_0016302c;
            uVar10 = local_128;
            local_168 = piVar9;
            if (0 < (int)uVar23) {
              ppIVar16 = &pTab->pIndex;
              iVar28 = pParse->nMem;
              uVar25 = 0;
              do {
                pIVar5 = *ppIVar16;
                pParse->nMem = iVar28 + 1;
                piVar9[uVar25] = iVar28 + 1;
                iVar28 = (uint)pIVar5->nColumn + pParse->nMem;
                pParse->nMem = iVar28;
                ppIVar16 = &pIVar5->pNext;
                uVar25 = uVar25 + 1;
              } while (uVar23 != uVar25);
            }
          }
          else {
            local_168 = (int *)0x0;
          }
          if (pUpsert != (Upsert *)0x0) {
            if (pTab->nModuleArg != 0) {
              sqlite3ErrorMsg(pParse,"UPSERT not implemented for virtual table \"%s\"",pTab->zName);
              goto LAB_0016302c;
            }
            local_f0->a[0].iCursor = iDataCur;
            pUpsert->pUpsertSrc = local_f0;
            pUpsert->regData = uVar20;
            pUpsert->iDataCur = iDataCur;
            pUpsert->iIdxCur = iIdxCur;
            if (pUpsert->pUpsertTarget != (ExprList *)0x0) {
              sqlite3UpsertAnalyzeTarget(pParse,local_f0,pUpsert);
            }
          }
          local_100 = CONCAT44(local_100._4_4_,uVar20);
          local_128 = uVar10;
          if ((byte)local_138 == '\0') {
            if (local_e8 == (Select *)0x0) {
              local_cc = 0;
              local_d0 = 0;
            }
            else {
              local_d0 = sqlite3VdbeAddOp3(p_00,0xe,local_88.iSDParm,0,0);
              local_cc = local_d0;
            }
          }
          else {
            local_d0 = sqlite3VdbeAddOp3(p_00,0x24,(int)local_118,0,0);
            local_cc = p_00->nOp;
          }
          uVar20 = pParse->nLabel - 1;
          pParse->nLabel = uVar20;
          local_148 = (int)uVar29;
          uVar10 = (ulong)uVar20;
          pTrigger = local_f8;
          if ((tmask & 1U) != 0) {
            local_b8 = (ulong)uVar20;
            iVar28 = sqlite3GetTempRange(pParse,pTab->nCol + 1);
            local_108 = CONCAT44(extraout_var,iVar28);
            if (local_148 < 0) {
              iVar21 = 0x46;
              iVar8 = -1;
            }
            else {
              if ((byte)local_138 == '\0') {
                sqlite3ExprCode(pParse,local_d8->a[uVar29].pExpr,iVar28);
              }
              else {
                sqlite3VdbeAddOp3(p_00,0x5a,(int)local_118,local_148,iVar28);
              }
              iVar8 = (int)local_108;
              iVar28 = sqlite3VdbeAddOp3(p_00,0x33,iVar8,0,0);
              sqlite3VdbeAddOp3(p_00,0x46,-1,iVar8,0);
              if (p_00->db->mallocFailed == '\0') {
                iVar8 = p_00->nOp + -1;
                if (-1 < iVar28) {
                  iVar8 = iVar28;
                }
                pOVar17 = p_00->aOp + iVar8;
              }
              else {
                pOVar17 = (Op *)&sqlite3VdbeGetOp_dummy;
              }
              pOVar17->p2 = p_00->nOp;
              iVar21 = 0xf;
              iVar8 = (int)local_108;
              iVar28 = 0;
            }
            sqlite3VdbeAddOp3(p_00,iVar21,iVar8,iVar28,0);
            uVar10 = local_118;
            uVar7 = pTab->nCol;
            if (0 < (short)uVar7) {
              local_c0 = CONCAT44(local_c0._4_4_,(uint)(pColumn == (IdList *)0x0));
              bVar26 = local_d8 != (ExprList *)0x0 | (byte)local_138;
              local_b0 = (ulong)((int)local_108 + 1);
              local_90 = local_d8->a;
              uVar25 = 0;
              iVar28 = 0;
              do {
                iVar21 = (int)uVar25;
                iVar8 = (int)local_b0;
                if (pColumn == (IdList *)0x0) {
                  if (bVar26 == 0) goto LAB_00163d40;
LAB_00163d79:
                  if ((byte)local_138 == '\0') {
                    sqlite3ExprCodeAndCache(pParse,local_90[iVar28].pExpr,iVar8 + iVar21);
                  }
                  else {
                    sqlite3VdbeAddOp3(p_00,0x5a,(int)uVar10,iVar28,iVar8 + iVar21);
                  }
                }
                else {
                  uVar20 = pColumn->nId;
                  if ((int)uVar20 < 1) {
                    uVar15 = 0;
                  }
                  else {
                    piVar9 = &pColumn->a->idx;
                    uVar15 = 0;
                    do {
                      if (uVar25 == (uint)*piVar9) goto LAB_00163d6e;
                      uVar15 = uVar15 + 1;
                      piVar9 = piVar9 + 4;
                    } while (uVar20 != uVar15);
                    uVar15 = (ulong)uVar20;
                  }
LAB_00163d6e:
                  iVar28 = (int)uVar15;
                  if ((bVar26 & iVar28 < (int)uVar20) != 0) goto LAB_00163d79;
LAB_00163d40:
                  sqlite3ExprCode(pParse,pTab->aCol[uVar25].pDflt,iVar8 + iVar21);
                }
                iVar28 = iVar28 + (int)local_c0;
                uVar25 = uVar25 + 1;
                uVar7 = pTab->nCol;
              } while ((long)uVar25 < (long)(short)uVar7);
            }
            if (local_a8 == (Select *)0x0) {
              sqlite3TableAffinity(p_00,pTab,(int)local_108 + 1);
              uVar7 = pTab->nCol;
            }
            uVar10 = local_b8;
            pTrigger = local_f8;
            sqlite3CodeRowTrigger
                      (pParse,local_f8,0x78,(ExprList *)0x0,1,pTab,(short)~uVar7 + (int)local_108,
                       (int)local_a0,(int)local_b8);
            sVar2 = pTab->nCol;
            if (sVar2 == 0) {
              if ((int)local_108 != 0) {
                bVar26 = pParse->nTempReg;
                if ((ulong)bVar26 < 8) {
                  pParse->nTempReg = bVar26 + 1;
                  piVar9 = pParse->aTempReg + bVar26;
                  goto LAB_00163ec3;
                }
              }
            }
            else if (pParse->nRangeReg <= (int)sVar2) {
              pParse->nRangeReg = sVar2 + 1;
              piVar9 = &pParse->iRangeReg;
LAB_00163ec3:
              *piVar9 = (int)local_108;
              uVar10 = local_b8;
              pTrigger = local_f8;
            }
          }
          if (local_a8 == (Select *)0x0) {
            local_b8 = uVar10;
            if (pTab->nModuleArg != 0) {
              sqlite3VdbeAddOp3(p_00,0x49,0,local_c8,0);
            }
            iVar28 = (int)local_120;
            if (local_148 < 0) {
              if ((pTab->nModuleArg != 0) ||
                 (uVar20 = local_12c & 1, local_12c = local_12c & 0xffffff01, uVar20 != 0)) {
                iVar21 = 0x49;
                iVar8 = 0;
                goto LAB_00164131;
              }
LAB_00163f60:
              sqlite3VdbeAddOp3(p_00,0x79,iDataCur,iVar28,local_10c);
              local_c0 = 1;
            }
            else {
              if ((byte)local_138 == '\0') {
                if (local_e8 != (Select *)0x0) {
                  iVar21 = local_148 + (int)local_128;
                  iVar22 = 0x4e;
                  iVar8 = 0;
                  local_148 = iVar28;
                  goto LAB_00163fbd;
                }
                pExpr = local_d8->a[uVar29].pExpr;
                if ((pExpr->op == 'r') && (pTab->nModuleArg == 0)) goto LAB_00163f60;
                sqlite3ExprCode(pParse,pExpr,iVar28);
              }
              else {
                iVar22 = 0x5a;
                iVar21 = (int)local_118;
                iVar8 = iVar28;
LAB_00163fbd:
                sqlite3VdbeAddOp3(p_00,iVar22,iVar21,local_148,iVar8);
              }
              iVar28 = (int)local_120;
              if (pTab->nModuleArg == 0) {
                iVar8 = sqlite3VdbeAddOp3(p_00,0x33,iVar28,0,0);
                sqlite3VdbeAddOp3(p_00,0x79,iDataCur,iVar28,local_10c);
                if (p_00->db->mallocFailed == '\0') {
                  iVar28 = p_00->nOp + -1;
                  if (-1 < iVar8) {
                    iVar28 = iVar8;
                  }
                  pOVar17 = p_00->aOp + iVar28;
                }
                else {
                  pOVar17 = (Op *)&sqlite3VdbeGetOp_dummy;
                }
                pOVar17->p2 = p_00->nOp;
              }
              else {
                sqlite3VdbeAddOp3(p_00,0x32,iVar28,p_00->nOp + 2,0);
              }
              iVar21 = 0xf;
              iVar8 = (int)local_120;
              iVar28 = 0;
LAB_00164131:
              local_c0 = 0;
              sqlite3VdbeAddOp3(p_00,iVar21,iVar8,iVar28,0);
            }
            if (0 < local_10c) {
              sqlite3VdbeAddOp3(pParse->pVdbe,0x97,local_10c,(int)local_120,0);
            }
            uVar10 = local_118;
            if (0 < pTab->nCol) {
              local_a8 = (Select *)local_d8->a;
              iVar28 = (uint)local_100;
              uVar25 = 0;
              local_12c = 0;
              do {
                iVar8 = iVar28 + (int)uVar25;
                if (uVar25 == (uint)(int)pTab->iPKey) {
                  op = 0x4a;
                  iVar22 = iVar8;
                  iVar21 = 0;
LAB_001641bd:
                  iVar8 = 0;
LAB_001641c0:
                  sqlite3VdbeAddOp3(p_00,op,iVar22,iVar21,iVar8);
                }
                else {
                  if (pColumn == (IdList *)0x0) {
                    if ((pTab->aCol[uVar25].colFlags & 2) == 0) {
                      uVar20 = (int)uVar25 - local_12c;
                      uVar15 = (ulong)uVar20;
                      if ((-1 < (int)uVar20) && (uVar14 != 0)) goto LAB_0016422d;
                    }
                    else {
                      local_12c = local_12c + 1;
                    }
                  }
                  else {
                    uVar20 = pColumn->nId;
                    if ((int)uVar20 < 1) {
                      uVar15 = 0;
                    }
                    else {
                      piVar9 = &pColumn->a->idx;
                      uVar15 = 0;
                      do {
                        if (uVar25 == (uint)*piVar9) goto LAB_00164221;
                        uVar15 = uVar15 + 1;
                        piVar9 = piVar9 + 4;
                      } while (uVar20 != uVar15);
                      uVar15 = (ulong)uVar20;
                    }
LAB_00164221:
                    if ((uVar14 != 0) && ((int)uVar15 < (int)uVar20)) {
LAB_0016422d:
                      iVar21 = (int)uVar15;
                      if ((byte)local_138 != '\0') {
                        op = 0x5a;
                        iVar22 = (int)uVar10;
                        goto LAB_001641c0;
                      }
                      if (local_e8 == (Select *)0x0) {
                        sqlite3ExprCode(pParse,*(Expr **)(local_a8->addrOpenEphm +
                                                         (uVar15 & 0xffffffff) * 8 + -7),iVar8);
                      }
                      else if ((int)local_128 != (uint)local_100) {
                        iVar22 = iVar21 + (int)local_128;
                        op = 0x4f;
                        iVar21 = iVar8;
                        goto LAB_001641bd;
                      }
                      goto LAB_00164292;
                    }
                  }
                  sqlite3ExprCodeFactorable(pParse,pTab->aCol[uVar25].pDflt,iVar8);
                }
LAB_00164292:
                uVar25 = uVar25 + 1;
              } while ((long)uVar25 < (long)pTab->nCol);
            }
            uVar20 = local_c8;
            if (pTab->nModuleArg == 0) {
              sqlite3GenerateConstraintChecks
                        (pParse,pTab,local_168,iDataCur,iIdxCur,local_c8,0,
                         (byte)~(byte)(uVar29 >> 0x18) >> 7,(u8)local_a0,(int)local_b8,&isReplace,
                         (int *)0x0,pUpsert);
              uVar14 = 0;
              sqlite3FkCheck(pParse,pTab,0,uVar20,(int *)0x0,0);
              if (isReplace == 0) {
                uVar14 = 1;
              }
              else if ((local_f8 == (Trigger *)0x0) && (uVar14 = 1, (db->flags & 0x4000) != 0)) {
                pHVar12 = findElementWithHash(&pTab->pSchema->fkeyHash,pTab->zName,(uint *)0x0);
                uVar14 = (uint)(pHVar12->data == (void *)0x0);
              }
              sqlite3CompleteInsertion
                        (pParse,pTab,iDataCur,iIdxCur,local_c8,local_168,0,(int)local_c0,uVar14);
              uVar10 = local_b8;
              pTrigger = local_f8;
            }
            else {
              for (zP4 = pTab->pVTable; zP4 != (VTable *)0x0; zP4 = zP4->pNext) {
                if (zP4->db == db) goto LAB_001642ef;
              }
              zP4 = (VTable *)0x0;
LAB_001642ef:
              sqlite3VtabMakeWritable(pParse,pTab);
              iVar28 = sqlite3VdbeAddOp3(p_00,10,1,pTab->nCol + 2,local_c8);
              sqlite3VdbeChangeP4(p_00,iVar28,(char *)zP4,-0xc);
              if (0 < (long)p_00->nOp) {
                uVar13 = 2;
                if ((int)local_a0 != 0xb) {
                  uVar13 = (u16)local_a0;
                }
                p_00->aOp[(long)p_00->nOp + -1].p5 = uVar13;
              }
              pPVar11 = pParse->pToplevel;
              if (pParse->pToplevel == (Parse *)0x0) {
                pPVar11 = pParse;
              }
              pPVar11->mayAbort = '\x01';
              uVar10 = local_b8;
              pTrigger = local_f8;
            }
          }
          if ((int)local_e0 != 0) {
            sqlite3VdbeAddOp3(p_00,0x53,(int)local_e0,1,0);
          }
          if (pTrigger != (Trigger *)0x0) {
            sqlite3CodeRowTrigger
                      (pParse,pTrigger,0x78,(ExprList *)0x0,2,pTab,(int)local_120 + ~(int)pTab->nCol
                       ,(int)local_a0,(int)uVar10);
          }
          sqlite3VdbeResolveLabel(p_00,(int)uVar10);
          if ((byte)local_138 == '\0') {
            if (local_e8 != (Select *)0x0) {
              sqlite3VdbeAddOp3(p_00,0xb,0,local_cc,0);
              if (p_00->db->mallocFailed == '\0') {
                iVar28 = p_00->nOp + -1;
                if (-1 < local_d0) {
                  iVar28 = local_d0;
                }
                pOVar17 = p_00->aOp + iVar28;
              }
              else {
                pOVar17 = (Op *)&sqlite3VdbeGetOp_dummy;
              }
              pOVar17->p2 = p_00->nOp;
            }
          }
          else {
            sqlite3VdbeAddOp3(p_00,5,(int)local_118,local_cc,0);
            if (p_00->db->mallocFailed == '\0') {
              iVar28 = p_00->nOp + -1;
              if (-1 < local_d0) {
                iVar28 = local_d0;
              }
              pOVar17 = p_00->aOp + iVar28;
            }
            else {
              pOVar17 = (Op *)&sqlite3VdbeGetOp_dummy;
            }
            pOVar17->p2 = p_00->nOp;
            sqlite3VdbeAddOp3(p_00,0x75,(int)local_118,0,0);
          }
          iVar28 = (int)local_e0;
          goto LAB_00163140;
        }
        local_168 = (int *)0x0;
        sqlite3ErrorMsg(pParse,"table %S has %d columns but %d values were supplied",local_f0,0,
                        (ulong)(uVar23 - iVar28),(ulong)uVar14);
      }
      else {
        if ((pColumn == (IdList *)0x0) || (uVar14 == pColumn->nId)) goto LAB_00163687;
        local_168 = (int *)0x0;
        sqlite3ErrorMsg(pParse,"%d values for %d columns");
      }
      goto LAB_0016302c;
    }
    local_40 = (undefined1  [16])0x0;
    local_50 = (undefined1  [16])0x0;
    local_60 = (undefined1  [16])0x0;
    uVar10 = 0;
    uVar14 = 0;
    _isReplace = pParse;
    if (local_d8 == (ExprList *)0x0) {
LAB_0016358f:
      local_118 = 0xffffffff;
      local_138 = (IdList_item *)((ulong)local_138 & 0xffffffff00000000);
      goto LAB_001635b3;
    }
    uVar14 = local_d8->nExpr;
    iVar28 = sqlite3ResolveExprListNames((NameContext *)&isReplace,local_d8);
    if (iVar28 == 0) goto LAB_0016358f;
    sqlite3SrcListDelete(db,local_f0);
    local_168 = (int *)0x0;
  }
  pSelect = local_e8;
  exprListDeleteNN(db,pList);
LAB_00162e7b:
  sqlite3UpsertDelete(db,pUpsert);
  if (pSelect != (Select *)0x0) {
    clearSelect(db,pSelect,1);
  }
  sqlite3IdListDelete(db,pColumn);
  if (local_168 != (int *)0x0) {
    sqlite3DbFreeNN(db,local_168);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Insert(
  Parse *pParse,        /* Parser context */
  SrcList *pTabList,    /* Name of table into which we are inserting */
  Select *pSelect,      /* A SELECT statement to use as the data source */
  IdList *pColumn,      /* Column names corresponding to IDLIST. */
  int onError,          /* How to handle constraint errors */
  Upsert *pUpsert       /* ON CONFLICT clauses for upsert, or NULL */
){
  sqlite3 *db;          /* The main database structure */
  Table *pTab;          /* The table to insert into.  aka TABLE */
  int i, j;             /* Loop counters */
  Vdbe *v;              /* Generate code into this virtual machine */
  Index *pIdx;          /* For looping over indices of the table */
  int nColumn;          /* Number of columns in the data */
  int nHidden = 0;      /* Number of hidden columns if TABLE is virtual */
  int iDataCur = 0;     /* VDBE cursor that is the main data repository */
  int iIdxCur = 0;      /* First index cursor */
  int ipkColumn = -1;   /* Column that is the INTEGER PRIMARY KEY */
  int endOfLoop;        /* Label for the end of the insertion loop */
  int srcTab = 0;       /* Data comes from this temporary cursor if >=0 */
  int addrInsTop = 0;   /* Jump to label "D" */
  int addrCont = 0;     /* Top of insert loop. Label "C" in templates 3 and 4 */
  SelectDest dest;      /* Destination for SELECT on rhs of INSERT */
  int iDb;              /* Index of database holding TABLE */
  u8 useTempTable = 0;  /* Store SELECT results in intermediate table */
  u8 appendFlag = 0;    /* True if the insert is likely to be an append */
  u8 withoutRowid;      /* 0 for normal table.  1 for WITHOUT ROWID table */
  u8 bIdListInOrder;    /* True if IDLIST is in table order */
  ExprList *pList = 0;  /* List of VALUES() to be inserted  */

  /* Register allocations */
  int regFromSelect = 0;/* Base register for data coming from SELECT */
  int regAutoinc = 0;   /* Register holding the AUTOINCREMENT counter */
  int regRowCount = 0;  /* Memory cell used for the row counter */
  int regIns;           /* Block of regs holding rowid+data being inserted */
  int regRowid;         /* registers holding insert rowid */
  int regData;          /* register holding first column to insert */
  int *aRegIdx = 0;     /* One register allocated to each index */

#ifndef SQLITE_OMIT_TRIGGER
  int isView;                 /* True if attempting to insert into a view */
  Trigger *pTrigger;          /* List of triggers on pTab, if required */
  int tmask;                  /* Mask of trigger times */
#endif

  db = pParse->db;
  if( pParse->nErr || db->mallocFailed ){
    goto insert_cleanup;
  }
  dest.iSDParm = 0;  /* Suppress a harmless compiler warning */

  /* If the Select object is really just a simple VALUES() list with a
  ** single row (the common case) then keep that one row of values
  ** and discard the other (unused) parts of the pSelect object
  */
  if( pSelect && (pSelect->selFlags & SF_Values)!=0 && pSelect->pPrior==0 ){
    pList = pSelect->pEList;
    pSelect->pEList = 0;
    sqlite3SelectDelete(db, pSelect);
    pSelect = 0;
  }

  /* Locate the table into which we will be inserting new information.
  */
  assert( pTabList->nSrc==1 );
  pTab = sqlite3SrcListLookup(pParse, pTabList);
  if( pTab==0 ){
    goto insert_cleanup;
  }
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  assert( iDb<db->nDb );
  if( sqlite3AuthCheck(pParse, SQLITE_INSERT, pTab->zName, 0,
                       db->aDb[iDb].zDbSName) ){
    goto insert_cleanup;
  }
  withoutRowid = !HasRowid(pTab);

  /* Figure out if we have any triggers and if the table being
  ** inserted into is a view
  */
#ifndef SQLITE_OMIT_TRIGGER
  pTrigger = sqlite3TriggersExist(pParse, pTab, TK_INSERT, 0, &tmask);
  isView = pTab->pSelect!=0;
#else
# define pTrigger 0
# define tmask 0
# define isView 0
#endif
#ifdef SQLITE_OMIT_VIEW
# undef isView
# define isView 0
#endif
  assert( (pTrigger && tmask) || (pTrigger==0 && tmask==0) );

  /* If pTab is really a view, make sure it has been initialized.
  ** ViewGetColumnNames() is a no-op if pTab is not a view.
  */
  if( sqlite3ViewGetColumnNames(pParse, pTab) ){
    goto insert_cleanup;
  }

  /* Cannot insert into a read-only table.
  */
  if( sqlite3IsReadOnly(pParse, pTab, tmask) ){
    goto insert_cleanup;
  }

  /* Allocate a VDBE
  */
  v = sqlite3GetVdbe(pParse);
  if( v==0 ) goto insert_cleanup;
  if( pParse->nested==0 ) sqlite3VdbeCountChanges(v);
  sqlite3BeginWriteOperation(pParse, pSelect || pTrigger, iDb);

#ifndef SQLITE_OMIT_XFER_OPT
  /* If the statement is of the form
  **
  **       INSERT INTO <table1> SELECT * FROM <table2>;
  **
  ** Then special optimizations can be applied that make the transfer
  ** very fast and which reduce fragmentation of indices.
  **
  ** This is the 2nd template.
  */
  if( pColumn==0 && xferOptimization(pParse, pTab, pSelect, onError, iDb) ){
    assert( !pTrigger );
    assert( pList==0 );
    goto insert_end;
  }
#endif /* SQLITE_OMIT_XFER_OPT */

  /* If this is an AUTOINCREMENT table, look up the sequence number in the
  ** sqlite_sequence table and store it in memory cell regAutoinc.
  */
  regAutoinc = autoIncBegin(pParse, iDb, pTab);

  /* Allocate registers for holding the rowid of the new row,
  ** the content of the new row, and the assembled row record.
  */
  regRowid = regIns = pParse->nMem+1;
  pParse->nMem += pTab->nCol + 1;
  if( IsVirtual(pTab) ){
    regRowid++;
    pParse->nMem++;
  }
  regData = regRowid+1;

  /* If the INSERT statement included an IDLIST term, then make sure
  ** all elements of the IDLIST really are columns of the table and 
  ** remember the column indices.
  **
  ** If the table has an INTEGER PRIMARY KEY column and that column
  ** is named in the IDLIST, then record in the ipkColumn variable
  ** the index into IDLIST of the primary key column.  ipkColumn is
  ** the index of the primary key as it appears in IDLIST, not as
  ** is appears in the original table.  (The index of the INTEGER
  ** PRIMARY KEY in the original table is pTab->iPKey.)
  */
  bIdListInOrder = (pTab->tabFlags & TF_OOOHidden)==0;
  if( pColumn ){
    for(i=0; i<pColumn->nId; i++){
      pColumn->a[i].idx = -1;
    }
    for(i=0; i<pColumn->nId; i++){
      for(j=0; j<pTab->nCol; j++){
        if( sqlite3StrICmp(pColumn->a[i].zName, pTab->aCol[j].zName)==0 ){
          pColumn->a[i].idx = j;
          if( i!=j ) bIdListInOrder = 0;
          if( j==pTab->iPKey ){
            ipkColumn = i;  assert( !withoutRowid );
          }
          break;
        }
      }
      if( j>=pTab->nCol ){
        if( sqlite3IsRowid(pColumn->a[i].zName) && !withoutRowid ){
          ipkColumn = i;
          bIdListInOrder = 0;
        }else{
          sqlite3ErrorMsg(pParse, "table %S has no column named %s",
              pTabList, 0, pColumn->a[i].zName);
          pParse->checkSchema = 1;
          goto insert_cleanup;
        }
      }
    }
  }

  /* Figure out how many columns of data are supplied.  If the data
  ** is coming from a SELECT statement, then generate a co-routine that
  ** produces a single row of the SELECT on each invocation.  The
  ** co-routine is the common header to the 3rd and 4th templates.
  */
  if( pSelect ){
    /* Data is coming from a SELECT or from a multi-row VALUES clause.
    ** Generate a co-routine to run the SELECT. */
    int regYield;       /* Register holding co-routine entry-point */
    int addrTop;        /* Top of the co-routine */
    int rc;             /* Result code */

    regYield = ++pParse->nMem;
    addrTop = sqlite3VdbeCurrentAddr(v) + 1;
    sqlite3VdbeAddOp3(v, OP_InitCoroutine, regYield, 0, addrTop);
    sqlite3SelectDestInit(&dest, SRT_Coroutine, regYield);
    dest.iSdst = bIdListInOrder ? regData : 0;
    dest.nSdst = pTab->nCol;
    rc = sqlite3Select(pParse, pSelect, &dest);
    regFromSelect = dest.iSdst;
    if( rc || db->mallocFailed || pParse->nErr ) goto insert_cleanup;
    sqlite3VdbeEndCoroutine(v, regYield);
    sqlite3VdbeJumpHere(v, addrTop - 1);                       /* label B: */
    assert( pSelect->pEList );
    nColumn = pSelect->pEList->nExpr;

    /* Set useTempTable to TRUE if the result of the SELECT statement
    ** should be written into a temporary table (template 4).  Set to
    ** FALSE if each output row of the SELECT can be written directly into
    ** the destination table (template 3).
    **
    ** A temp table must be used if the table being updated is also one
    ** of the tables being read by the SELECT statement.  Also use a 
    ** temp table in the case of row triggers.
    */
    if( pTrigger || readsTable(pParse, iDb, pTab) ){
      useTempTable = 1;
    }

    if( useTempTable ){
      /* Invoke the coroutine to extract information from the SELECT
      ** and add it to a transient table srcTab.  The code generated
      ** here is from the 4th template:
      **
      **      B: open temp table
      **      L: yield X, goto M at EOF
      **         insert row from R..R+n into temp table
      **         goto L
      **      M: ...
      */
      int regRec;          /* Register to hold packed record */
      int regTempRowid;    /* Register to hold temp table ROWID */
      int addrL;           /* Label "L" */

      srcTab = pParse->nTab++;
      regRec = sqlite3GetTempReg(pParse);
      regTempRowid = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp2(v, OP_OpenEphemeral, srcTab, nColumn);
      addrL = sqlite3VdbeAddOp1(v, OP_Yield, dest.iSDParm); VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regFromSelect, nColumn, regRec);
      sqlite3VdbeAddOp2(v, OP_NewRowid, srcTab, regTempRowid);
      sqlite3VdbeAddOp3(v, OP_Insert, srcTab, regRec, regTempRowid);
      sqlite3VdbeGoto(v, addrL);
      sqlite3VdbeJumpHere(v, addrL);
      sqlite3ReleaseTempReg(pParse, regRec);
      sqlite3ReleaseTempReg(pParse, regTempRowid);
    }
  }else{
    /* This is the case if the data for the INSERT is coming from a 
    ** single-row VALUES clause
    */
    NameContext sNC;
    memset(&sNC, 0, sizeof(sNC));
    sNC.pParse = pParse;
    srcTab = -1;
    assert( useTempTable==0 );
    if( pList ){
      nColumn = pList->nExpr;
      if( sqlite3ResolveExprListNames(&sNC, pList) ){
        goto insert_cleanup;
      }
    }else{
      nColumn = 0;
    }
  }

  /* If there is no IDLIST term but the table has an integer primary
  ** key, the set the ipkColumn variable to the integer primary key 
  ** column index in the original table definition.
  */
  if( pColumn==0 && nColumn>0 ){
    ipkColumn = pTab->iPKey;
  }

  /* Make sure the number of columns in the source data matches the number
  ** of columns to be inserted into the table.
  */
  for(i=0; i<pTab->nCol; i++){
    nHidden += (IsHiddenColumn(&pTab->aCol[i]) ? 1 : 0);
  }
  if( pColumn==0 && nColumn && nColumn!=(pTab->nCol-nHidden) ){
    sqlite3ErrorMsg(pParse, 
       "table %S has %d columns but %d values were supplied",
       pTabList, 0, pTab->nCol-nHidden, nColumn);
    goto insert_cleanup;
  }
  if( pColumn!=0 && nColumn!=pColumn->nId ){
    sqlite3ErrorMsg(pParse, "%d values for %d columns", nColumn, pColumn->nId);
    goto insert_cleanup;
  }
    
  /* Initialize the count of rows to be inserted
  */
  if( (db->flags & SQLITE_CountRows)!=0
   && !pParse->nested
   && !pParse->pTriggerTab
  ){
    regRowCount = ++pParse->nMem;
    sqlite3VdbeAddOp2(v, OP_Integer, 0, regRowCount);
  }

  /* If this is not a view, open the table and and all indices */
  if( !isView ){
    int nIdx;
    nIdx = sqlite3OpenTableAndIndices(pParse, pTab, OP_OpenWrite, 0, -1, 0,
                                      &iDataCur, &iIdxCur);
    aRegIdx = sqlite3DbMallocRawNN(db, sizeof(int)*(nIdx+1));
    if( aRegIdx==0 ){
      goto insert_cleanup;
    }
    for(i=0, pIdx=pTab->pIndex; i<nIdx; pIdx=pIdx->pNext, i++){
      assert( pIdx );
      aRegIdx[i] = ++pParse->nMem;
      pParse->nMem += pIdx->nColumn;
    }
  }
#ifndef SQLITE_OMIT_UPSERT
  if( pUpsert ){
    if( IsVirtual(pTab) ){
      sqlite3ErrorMsg(pParse, "UPSERT not implemented for virtual table \"%s\"",
              pTab->zName);
      goto insert_cleanup;
    }
    pTabList->a[0].iCursor = iDataCur;
    pUpsert->pUpsertSrc = pTabList;
    pUpsert->regData = regData;
    pUpsert->iDataCur = iDataCur;
    pUpsert->iIdxCur = iIdxCur;
    if( pUpsert->pUpsertTarget ){
      sqlite3UpsertAnalyzeTarget(pParse, pTabList, pUpsert);
    }
  }
#endif


  /* This is the top of the main insertion loop */
  if( useTempTable ){
    /* This block codes the top of loop only.  The complete loop is the
    ** following pseudocode (template 4):
    **
    **         rewind temp table, if empty goto D
    **      C: loop over rows of intermediate table
    **           transfer values form intermediate table into <table>
    **         end loop
    **      D: ...
    */
    addrInsTop = sqlite3VdbeAddOp1(v, OP_Rewind, srcTab); VdbeCoverage(v);
    addrCont = sqlite3VdbeCurrentAddr(v);
  }else if( pSelect ){
    /* This block codes the top of loop only.  The complete loop is the
    ** following pseudocode (template 3):
    **
    **      C: yield X, at EOF goto D
    **         insert the select result into <table> from R..R+n
    **         goto C
    **      D: ...
    */
    addrInsTop = addrCont = sqlite3VdbeAddOp1(v, OP_Yield, dest.iSDParm);
    VdbeCoverage(v);
  }

  /* Run the BEFORE and INSTEAD OF triggers, if there are any
  */
  endOfLoop = sqlite3VdbeMakeLabel(pParse);
  if( tmask & TRIGGER_BEFORE ){
    int regCols = sqlite3GetTempRange(pParse, pTab->nCol+1);

    /* build the NEW.* reference row.  Note that if there is an INTEGER
    ** PRIMARY KEY into which a NULL is being inserted, that NULL will be
    ** translated into a unique ID for the row.  But on a BEFORE trigger,
    ** we do not know what the unique ID will be (because the insert has
    ** not happened yet) so we substitute a rowid of -1
    */
    if( ipkColumn<0 ){
      sqlite3VdbeAddOp2(v, OP_Integer, -1, regCols);
    }else{
      int addr1;
      assert( !withoutRowid );
      if( useTempTable ){
        sqlite3VdbeAddOp3(v, OP_Column, srcTab, ipkColumn, regCols);
      }else{
        assert( pSelect==0 );  /* Otherwise useTempTable is true */
        sqlite3ExprCode(pParse, pList->a[ipkColumn].pExpr, regCols);
      }
      addr1 = sqlite3VdbeAddOp1(v, OP_NotNull, regCols); VdbeCoverage(v);
      sqlite3VdbeAddOp2(v, OP_Integer, -1, regCols);
      sqlite3VdbeJumpHere(v, addr1);
      sqlite3VdbeAddOp1(v, OP_MustBeInt, regCols); VdbeCoverage(v);
    }

    /* Cannot have triggers on a virtual table. If it were possible,
    ** this block would have to account for hidden column.
    */
    assert( !IsVirtual(pTab) );

    /* Create the new column data
    */
    for(i=j=0; i<pTab->nCol; i++){
      if( pColumn ){
        for(j=0; j<pColumn->nId; j++){
          if( pColumn->a[j].idx==i ) break;
        }
      }
      if( (!useTempTable && !pList) || (pColumn && j>=pColumn->nId)
            || (pColumn==0 && IsOrdinaryHiddenColumn(&pTab->aCol[i])) ){
        sqlite3ExprCode(pParse, pTab->aCol[i].pDflt, regCols+i+1);
      }else if( useTempTable ){
        sqlite3VdbeAddOp3(v, OP_Column, srcTab, j, regCols+i+1); 
      }else{
        assert( pSelect==0 ); /* Otherwise useTempTable is true */
        sqlite3ExprCodeAndCache(pParse, pList->a[j].pExpr, regCols+i+1);
      }
      if( pColumn==0 && !IsOrdinaryHiddenColumn(&pTab->aCol[i]) ) j++;
    }

    /* If this is an INSERT on a view with an INSTEAD OF INSERT trigger,
    ** do not attempt any conversions before assembling the record.
    ** If this is a real table, attempt conversions as required by the
    ** table column affinities.
    */
    if( !isView ){
      sqlite3TableAffinity(v, pTab, regCols+1);
    }

    /* Fire BEFORE or INSTEAD OF triggers */
    sqlite3CodeRowTrigger(pParse, pTrigger, TK_INSERT, 0, TRIGGER_BEFORE, 
        pTab, regCols-pTab->nCol-1, onError, endOfLoop);

    sqlite3ReleaseTempRange(pParse, regCols, pTab->nCol+1);
  }

  /* Compute the content of the next row to insert into a range of
  ** registers beginning at regIns.
  */
  if( !isView ){
    if( IsVirtual(pTab) ){
      /* The row that the VUpdate opcode will delete: none */
      sqlite3VdbeAddOp2(v, OP_Null, 0, regIns);
    }
    if( ipkColumn>=0 ){
      if( useTempTable ){
        sqlite3VdbeAddOp3(v, OP_Column, srcTab, ipkColumn, regRowid);
      }else if( pSelect ){
        sqlite3VdbeAddOp2(v, OP_Copy, regFromSelect+ipkColumn, regRowid);
      }else{
        Expr *pIpk = pList->a[ipkColumn].pExpr;
        if( pIpk->op==TK_NULL && !IsVirtual(pTab) ){
          sqlite3VdbeAddOp3(v, OP_NewRowid, iDataCur, regRowid, regAutoinc);
          appendFlag = 1;
        }else{
          sqlite3ExprCode(pParse, pList->a[ipkColumn].pExpr, regRowid);
        }
      }
      /* If the PRIMARY KEY expression is NULL, then use OP_NewRowid
      ** to generate a unique primary key value.
      */
      if( !appendFlag ){
        int addr1;
        if( !IsVirtual(pTab) ){
          addr1 = sqlite3VdbeAddOp1(v, OP_NotNull, regRowid); VdbeCoverage(v);
          sqlite3VdbeAddOp3(v, OP_NewRowid, iDataCur, regRowid, regAutoinc);
          sqlite3VdbeJumpHere(v, addr1);
        }else{
          addr1 = sqlite3VdbeCurrentAddr(v);
          sqlite3VdbeAddOp2(v, OP_IsNull, regRowid, addr1+2); VdbeCoverage(v);
        }
        sqlite3VdbeAddOp1(v, OP_MustBeInt, regRowid); VdbeCoverage(v);
      }
    }else if( IsVirtual(pTab) || withoutRowid ){
      sqlite3VdbeAddOp2(v, OP_Null, 0, regRowid);
    }else{
      sqlite3VdbeAddOp3(v, OP_NewRowid, iDataCur, regRowid, regAutoinc);
      appendFlag = 1;
    }
    autoIncStep(pParse, regAutoinc, regRowid);

    /* Compute data for all columns of the new entry, beginning
    ** with the first column.
    */
    nHidden = 0;
    for(i=0; i<pTab->nCol; i++){
      int iRegStore = regRowid+1+i;
      if( i==pTab->iPKey ){
        /* The value of the INTEGER PRIMARY KEY column is always a NULL.
        ** Whenever this column is read, the rowid will be substituted
        ** in its place.  Hence, fill this column with a NULL to avoid
        ** taking up data space with information that will never be used.
        ** As there may be shallow copies of this value, make it a soft-NULL */
        sqlite3VdbeAddOp1(v, OP_SoftNull, iRegStore);
        continue;
      }
      if( pColumn==0 ){
        if( IsHiddenColumn(&pTab->aCol[i]) ){
          j = -1;
          nHidden++;
        }else{
          j = i - nHidden;
        }
      }else{
        for(j=0; j<pColumn->nId; j++){
          if( pColumn->a[j].idx==i ) break;
        }
      }
      if( j<0 || nColumn==0 || (pColumn && j>=pColumn->nId) ){
        sqlite3ExprCodeFactorable(pParse, pTab->aCol[i].pDflt, iRegStore);
      }else if( useTempTable ){
        sqlite3VdbeAddOp3(v, OP_Column, srcTab, j, iRegStore); 
      }else if( pSelect ){
        if( regFromSelect!=regData ){
          sqlite3VdbeAddOp2(v, OP_SCopy, regFromSelect+j, iRegStore);
        }
      }else{
        sqlite3ExprCode(pParse, pList->a[j].pExpr, iRegStore);
      }
    }

    /* Generate code to check constraints and generate index keys and
    ** do the insertion.
    */
#ifndef SQLITE_OMIT_VIRTUALTABLE
    if( IsVirtual(pTab) ){
      const char *pVTab = (const char *)sqlite3GetVTable(db, pTab);
      sqlite3VtabMakeWritable(pParse, pTab);
      sqlite3VdbeAddOp4(v, OP_VUpdate, 1, pTab->nCol+2, regIns, pVTab, P4_VTAB);
      sqlite3VdbeChangeP5(v, onError==OE_Default ? OE_Abort : onError);
      sqlite3MayAbort(pParse);
    }else
#endif
    {
      int isReplace;    /* Set to true if constraints may cause a replace */
      int bUseSeek;     /* True to use OPFLAG_SEEKRESULT */
      sqlite3GenerateConstraintChecks(pParse, pTab, aRegIdx, iDataCur, iIdxCur,
          regIns, 0, ipkColumn>=0, onError, endOfLoop, &isReplace, 0, pUpsert
      );
      sqlite3FkCheck(pParse, pTab, 0, regIns, 0, 0);

      /* Set the OPFLAG_USESEEKRESULT flag if either (a) there are no REPLACE
      ** constraints or (b) there are no triggers and this table is not a
      ** parent table in a foreign key constraint. It is safe to set the
      ** flag in the second case as if any REPLACE constraint is hit, an
      ** OP_Delete or OP_IdxDelete instruction will be executed on each 
      ** cursor that is disturbed. And these instructions both clear the
      ** VdbeCursor.seekResult variable, disabling the OPFLAG_USESEEKRESULT
      ** functionality.  */
      bUseSeek = (isReplace==0 || (pTrigger==0 &&
          ((db->flags & SQLITE_ForeignKeys)==0 || sqlite3FkReferences(pTab)==0)
      ));
      sqlite3CompleteInsertion(pParse, pTab, iDataCur, iIdxCur,
          regIns, aRegIdx, 0, appendFlag, bUseSeek
      );
    }
  }

  /* Update the count of rows that are inserted
  */
  if( regRowCount ){
    sqlite3VdbeAddOp2(v, OP_AddImm, regRowCount, 1);
  }

  if( pTrigger ){
    /* Code AFTER triggers */
    sqlite3CodeRowTrigger(pParse, pTrigger, TK_INSERT, 0, TRIGGER_AFTER, 
        pTab, regData-2-pTab->nCol, onError, endOfLoop);
  }

  /* The bottom of the main insertion loop, if the data source
  ** is a SELECT statement.
  */
  sqlite3VdbeResolveLabel(v, endOfLoop);
  if( useTempTable ){
    sqlite3VdbeAddOp2(v, OP_Next, srcTab, addrCont); VdbeCoverage(v);
    sqlite3VdbeJumpHere(v, addrInsTop);
    sqlite3VdbeAddOp1(v, OP_Close, srcTab);
  }else if( pSelect ){
    sqlite3VdbeGoto(v, addrCont);
    sqlite3VdbeJumpHere(v, addrInsTop);
  }

insert_end:
  /* Update the sqlite_sequence table by storing the content of the
  ** maximum rowid counter values recorded while inserting into
  ** autoincrement tables.
  */
  if( pParse->nested==0 && pParse->pTriggerTab==0 ){
    sqlite3AutoincrementEnd(pParse);
  }

  /*
  ** Return the number of rows inserted. If this routine is 
  ** generating code because of a call to sqlite3NestedParse(), do not
  ** invoke the callback function.
  */
  if( regRowCount ){
    sqlite3VdbeAddOp2(v, OP_ResultRow, regRowCount, 1);
    sqlite3VdbeSetNumCols(v, 1);
    sqlite3VdbeSetColName(v, 0, COLNAME_NAME, "rows inserted", SQLITE_STATIC);
  }

insert_cleanup:
  sqlite3SrcListDelete(db, pTabList);
  sqlite3ExprListDelete(db, pList);
  sqlite3UpsertDelete(db, pUpsert);
  sqlite3SelectDelete(db, pSelect);
  sqlite3IdListDelete(db, pColumn);
  sqlite3DbFree(db, aRegIdx);
}